

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAtomicRMW(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  ushort uVar1;
  long lVar2;
  PSNodesSeq *pPVar3;
  PSNode *pPVar4;
  uint64_t uVar5;
  uint uVar6;
  uint64_t size;
  Instruction *pIVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>,_bool>
  pVar8;
  PSNode *M;
  PSNode *ptr;
  Offset cval;
  PSNodesSeq ret;
  PSNode *local_a8;
  PSNode *local_a0;
  Offset local_98;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_90;
  PSNode *local_78;
  initializer_list<dg::pta::PSNode_*> local_70;
  PSNodesSeq local_60;
  PSNode *local_40;
  PSNode *local_38;
  
  pIVar7 = (Instruction *)0x0;
  if (Inst[0x10] == (Instruction)0x40) {
    pIVar7 = Inst;
  }
  uVar1 = *(ushort *)(pIVar7 + 0x12);
  uVar6 = uVar1 >> 4 & 0xf;
  if (2 < (ushort)uVar6) {
    pPVar3 = createUnknown(this,(Value *)Inst);
    return pPVar3;
  }
  local_a0 = getOperand(this,*(Value **)(pIVar7 + -0x40));
  uVar5 = Offset::UNKNOWN;
  local_98.offset = Offset::UNKNOWN;
  pPVar4 = PointerGraph::create<(dg::pta::PSNodeType)2,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_a0);
  local_a8 = (PSNode *)0x0;
  if ((ushort)uVar6 != 2) {
    if (uVar6 == 1) {
      lVar2 = *(long *)(pIVar7 + -0x20);
      if ((lVar2 != 0) && (*(char *)(lVar2 + 0x10) == '\x10')) {
        uVar5 = llvm::APInt::getLimitedValue((APInt *)(lVar2 + 0x18),0xffffffffffffffff);
      }
      local_98.offset = uVar5;
      local_a8 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,dg::Offset&>
                           ((PointerGraph *)this,&local_a0,&local_98);
      SubgraphNode<dg::pta::PSNode>::addSuccessor
                (&pPVar4->super_SubgraphNode<dg::pta::PSNode>,local_a8);
    }
    else {
      if ((uVar1 >> 4 & 0xf) != 0) {
        abort();
      }
      local_a8 = getOperand(this,*(Value **)(pIVar7 + -0x20));
    }
  }
  local_38 = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                       ((PointerGraph *)this,&local_a8,&local_a0);
  if (uVar6 - 1 < 2) {
    SubgraphNode<dg::pta::PSNode>::addSuccessor
              (&local_a8->super_SubgraphNode<dg::pta::PSNode>,local_38);
  }
  local_70._M_array = &local_40;
  local_70._M_len = 2;
  local_40 = pPVar4;
  PSNodesSeq::PSNodesSeq(&local_60,&local_70);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::vector
            (&local_90,&local_60._nodes);
  local_78 = local_60._repr;
  if (local_60._repr == (PSNode *)0x0) {
    local_60._repr =
         local_90.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish[-1];
  }
  ((local_60._repr)->super_SubgraphNode<dg::pta::PSNode>).user_data = Inst;
  local_70._M_array = (iterator)Inst;
  pVar8 = std::
          _Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<llvm::Value_const*&,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>
                    ((_Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x188),&local_70,&local_90);
  if (local_90.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60._nodes.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60._nodes.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60._nodes.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60._nodes.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (PSNodesSeq *)
         ((long)pVar8.first.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
         + 0x10);
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAtomicRMW(const llvm::Instruction *Inst) {
    using namespace llvm;

    const auto *RMW = dyn_cast<AtomicRMWInst>(Inst);
    assert(RMW && "Wrong instruction");

    auto operation = RMW->getOperation();
    if (operation != AtomicRMWInst::Xchg && operation != AtomicRMWInst::Add &&
        operation != AtomicRMWInst::Sub) {
        return createUnknown(Inst);
    }

    auto *ptr = getOperand(RMW->getPointerOperand());
    Offset cval = Offset::UNKNOWN;

    auto *R = PS.create<PSNodeType::LOAD>(ptr);

    PSNode *M = nullptr;
    switch (operation) {
    case AtomicRMWInst::Xchg:
        M = getOperand(RMW->getValOperand());
        break;
    case AtomicRMWInst::Add:
        cval = Offset(llvmutils::getConstantValue(RMW->getValOperand()));
        M = PS.create<PSNodeType::GEP>(ptr, cval);
        R->addSuccessor(M);
        break;
    case AtomicRMWInst::Sub:
        break;
        cval = Offset(0) -
               Offset(llvmutils::getConstantValue(RMW->getValOperand()));
        M = PS.create<PSNodeType::GEP>(ptr, cval);
        R->addSuccessor(M);
        break;
    default:
        assert(false && "Invalid operation");
        abort();
    }
    assert(M);

    auto *W = PS.create<PSNodeType::STORE>(M, ptr);
    if (operation == AtomicRMWInst::Add || operation == AtomicRMWInst::Sub) {
        M->addSuccessor(W);
    }

    PSNodesSeq ret({R, W});
    return addNode(Inst, ret);
}